

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O0

_Bool al_register_sample_loader(char *ext,_func_ALLEGRO_SAMPLE_ptr_char_ptr *loader)

{
  size_t sVar1;
  ACODEC_TABLE *pAVar2;
  _func_ALLEGRO_SAMPLE_ptr_char_ptr *in_RSI;
  char *in_RDI;
  ACODEC_TABLE *ent;
  _Bool local_1;
  
  sVar1 = strlen(in_RDI);
  if (sVar1 + 1 < 0x20) {
    pAVar2 = find_acodec_table_entry((char *)in_RSI);
    if (in_RSI == (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0) {
      if ((pAVar2 == (ACODEC_TABLE *)0x0) ||
         (pAVar2->loader == (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0)) {
        return false;
      }
    }
    else if (pAVar2 == (ACODEC_TABLE *)0x0) {
      pAVar2 = add_acodec_table_entry((char *)0x0);
    }
    pAVar2->loader = in_RSI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool al_register_sample_loader(const char *ext,
   ALLEGRO_SAMPLE *(*loader)(const char *filename))
{
   ACODEC_TABLE *ent;

   if (strlen(ext) + 1 >= MAX_EXTENSION_LENGTH) {
      return false;
   }

   ent = find_acodec_table_entry(ext);
   if (!loader) {
      if (!ent || !ent->loader) {
         return false; /* Nothing to remove. */
      }
   }
   else if (!ent) {
      ent = add_acodec_table_entry(ext);
   }

   ent->loader = loader;

   return true;
}